

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.pb.h
# Opt level: O0

Int64Range * __thiscall CoreML::Specification::Int64Parameter::mutable_range(Int64Parameter *this)

{
  bool bVar1;
  Int64Range *this_00;
  Int64Parameter *this_local;
  
  bVar1 = has_range(this);
  if (!bVar1) {
    clear_AllowedValues(this);
    set_has_range(this);
    this_00 = (Int64Range *)operator_new(0x28);
    Int64Range::Int64Range(this_00);
    (this->AllowedValues_).range_ = this_00;
  }
  return (this->AllowedValues_).range_;
}

Assistant:

inline ::CoreML::Specification::Int64Range* Int64Parameter::mutable_range() {
  if (!has_range()) {
    clear_AllowedValues();
    set_has_range();
    AllowedValues_.range_ = new ::CoreML::Specification::Int64Range;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Int64Parameter.range)
  return AllowedValues_.range_;
}